

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

void rewind_coloring(saucy *s,coloring *c,int lev)

{
  int iVar1;
  int cf;
  int ff;
  int *piVar2;
  long lVar3;
  
  iVar1 = s->splitlev[lev];
  for (lVar3 = (long)s->nsplits; iVar1 < lVar3; lVar3 = lVar3 + -1) {
    cf = s->splitfrom[lVar3 + -1];
    ff = s->splitwho[lVar3 + -1];
    piVar2 = c->clen;
    piVar2[cf] = piVar2[ff] + 1 + piVar2[cf];
    fix_fronts(c,cf,ff);
  }
  return;
}

Assistant:

static void
rewind_coloring(struct saucy *s, struct coloring *c, int lev)
{
    int i, cf, ff, splits = s->splitlev[lev];
    for (i = s->nsplits - 1; i >= splits; --i) {
        cf = s->splitfrom[i];
        ff = s->splitwho[i];
        c->clen[cf] += c->clen[ff] + 1;
        fix_fronts(c, cf, ff);
    }
}